

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_regex(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char **ppcVar7;
  char **ppcVar8;
  bson_t *bcon;
  char *flags;
  char *regex;
  
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("^foo|bar$");
  pcVar5 = bcon_ensure_const_char_ptr("i");
  uVar3 = bcon_new(0,"foo",uVar3,10,pcVar4,pcVar5,0);
  uVar6 = bson_bcone_magic();
  ppcVar7 = bcon_ensure_const_char_ptr_ptr(&flags);
  ppcVar8 = bcon_ensure_const_char_ptr_ptr((char **)&bcon);
  bVar1 = bcon_extract(uVar3,"foo",uVar6,10,ppcVar7,ppcVar8,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x95,"test_regex","BCON_EXTRACT (bcon, \"foo\", BCONE_REGEX (regex, flags))");
    abort();
  }
  iVar2 = strcmp(flags,"^foo|bar$");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x97,"test_regex","strcmp (regex, \"^foo|bar$\") == 0");
    abort();
  }
  iVar2 = strcmp((char *)bcon,"i");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x98,"test_regex","strcmp (flags, \"i\") == 0");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_regex (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   /* option flags are sorted */
   bson_append_regex (&expected, "foo", -1, "^foo|bar$", "mis");
   BCON_APPEND (&bcon, "foo", BCON_REGEX ("^foo|bar$", "msi"));
   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}